

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

void loader_impl_configuration_execution_paths(loader_impl_interface iface,loader_impl impl)

{
  type_id tVar1;
  undefined8 in_RSI;
  long in_RDI;
  loader_path execution_path;
  size_t str_size;
  char *str;
  size_t iterator;
  value *execution_paths_array;
  size_t size;
  value execution_paths_value;
  undefined4 in_stack_ffffffffffffef98;
  type_id in_stack_ffffffffffffef9c;
  char *in_stack_ffffffffffffefa0;
  configuration in_stack_ffffffffffffefa8;
  char *in_stack_ffffffffffffefb0;
  char local_1048 [4104];
  char *local_40;
  char *local_38;
  ulong local_30;
  value *local_28;
  size_t local_20;
  value local_18;
  undefined8 local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = configuration_value_type
                       (in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                        in_stack_ffffffffffffef9c);
  if (local_18 != (value)0x0) {
    local_20 = value_type_count((void *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98
                                                ));
    local_28 = value_to_array((value)0x12fdad);
    for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
      tVar1 = value_type_id(in_stack_ffffffffffffefb0);
      if (tVar1 == 7) {
        local_38 = value_to_string((value)0x12fe12);
        local_40 = (char *)value_type_size(in_stack_ffffffffffffefa0);
        if (local_38 != (char *)0x0) {
          in_stack_ffffffffffffefa0 = local_40;
          if ((char *)0x1000 < local_40) {
            in_stack_ffffffffffffefa0 = (char *)0x1000;
          }
          in_stack_ffffffffffffefb0 = local_38;
          strncpy(local_1048,local_38,(size_t)in_stack_ffffffffffffefa0);
          (**(code **)(local_8 + 8))(local_10,local_1048);
        }
      }
    }
  }
  return;
}

Assistant:

void loader_impl_configuration_execution_paths(loader_impl_interface iface, loader_impl impl)
{
	value execution_paths_value = configuration_value_type(impl->config, "execution_paths", TYPE_ARRAY);

	if (execution_paths_value != NULL)
	{
		size_t size = value_type_count(execution_paths_value);
		value *execution_paths_array = value_to_array(execution_paths_value);
		size_t iterator;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_type_id(execution_paths_array[iterator]) == TYPE_STRING)
			{
				const char *str = value_to_string(execution_paths_array[iterator]);
				size_t str_size = value_type_size(execution_paths_array[iterator]);

				if (str != NULL)
				{
					loader_path execution_path;

					strncpy(execution_path, str, str_size > LOADER_PATH_SIZE ? LOADER_PATH_SIZE : str_size);

					iface->execution_path(impl, execution_path);
				}
			}
		}
	}
}